

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate2<float>::apply
          (QGate2<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,int offset)

{
  long i_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  value_type vVar7;
  int64_t iVar8;
  reference pvVar9;
  int64_t iVar10;
  float *pfVar11;
  long lVar12;
  long i_01;
  long i_02;
  byte bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float x4_1;
  float x3_1;
  float x2_1;
  float x1_1;
  int64_t i4;
  int64_t i3;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  int64_t nRight_1;
  int64_t nLeft_1;
  SquareMatrix<float> local_c8;
  float local_b8;
  float local_b4;
  float x4;
  float x3;
  float x2;
  float x1;
  int64_t j4;
  int64_t j3;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  undefined1 local_50 [8];
  SquareMatrix<float> mat2;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  SquareMatrix<float> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QGate2<float> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  iVar8 = dense::SquareMatrix<float>::size(matrix);
  bVar13 = (byte)nbQubits;
  if (iVar8 != 1 << (bVar13 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  (*(this->super_QObject<float>)._vptr_QObject[5])(&mat2.data_);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  *pvVar9 = offset + *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  *pvVar9 = offset + *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  if (nbQubits <= *pvVar9) {
    __assert_fail("qubits[0] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  if (nbQubits <= *pvVar9) {
    __assert_fail("qubits[1] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  iVar6 = *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  if (iVar6 + 1 != *pvVar9) {
    __assert_fail("qubits[0] + 1 == qubits[1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x29,
                  "virtual void qclab::qgates::QGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  (*(this->super_QObject<float>)._vptr_QObject[7])(local_50);
  dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,(SquareMatrix<float> *)local_50);
  if (side == Left) {
    if (nbQubits == 2) {
      dense::SquareMatrix<float>::operator*=(matrix,(SquareMatrix<float> *)local_50);
    }
    else {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
      nRight = (int64_t)(1 << ((byte)*pvVar9 & 0x1f));
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
      i = (int64_t)(1 << ((bVar13 - (char)*pvVar9) - 1 & 0x1f));
      for (k = 0; iVar8 = k, iVar10 = dense::SquareMatrix<float>::rows(matrix), iVar8 < iVar10;
          k = k + 1) {
        for (j = 0; j < nRight; j = j + 1) {
          for (j1 = 0; j1 < i; j1 = j1 + 1) {
            j2 = j1 + j * i * 4;
            j3 = j2 + i;
            j4 = j3 + i;
            _x2 = j4 + i;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,j2);
            x3 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,j3);
            x4 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,j4);
            local_b4 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,_x2);
            local_b8 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,0);
            fVar2 = x3;
            fVar1 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,0);
            fVar16 = *pfVar11 * x4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,0);
            fVar14 = *pfVar11 * local_b4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,0);
            fVar15 = *pfVar11 * local_b8;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,j2);
            *pfVar11 = fVar15 + fVar14 + fVar1 * fVar2 + fVar16;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,1);
            fVar2 = x3;
            fVar1 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,1);
            fVar16 = *pfVar11 * x4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,1);
            fVar14 = *pfVar11 * local_b4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,1);
            fVar15 = *pfVar11 * local_b8;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,j3);
            *pfVar11 = fVar15 + fVar14 + fVar1 * fVar2 + fVar16;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,2);
            fVar2 = x3;
            fVar1 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,2);
            fVar16 = *pfVar11 * x4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,2);
            fVar14 = *pfVar11 * local_b4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,2);
            fVar15 = *pfVar11 * local_b8;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,j4);
            *pfVar11 = fVar15 + fVar14 + fVar1 * fVar2 + fVar16;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,3);
            fVar2 = x3;
            fVar1 = *pfVar11;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,3);
            fVar16 = *pfVar11 * x4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,3);
            fVar14 = *pfVar11 * local_b4;
            pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,3);
            fVar15 = *pfVar11 * local_b8;
            pfVar11 = dense::SquareMatrix<float>::operator()(matrix,k,_x2);
            *pfVar11 = fVar15 + fVar14 + fVar1 * fVar2 + fVar16;
          }
        }
      }
    }
  }
  else if (nbQubits == 2) {
    dense::SquareMatrix<float>::SquareMatrix
              ((SquareMatrix<float> *)&nLeft_1,(SquareMatrix<float> *)local_50);
    dense::operator*((dense *)&local_c8,(SquareMatrix<float> *)&nLeft_1,matrix);
    dense::SquareMatrix<float>::operator=(matrix,&local_c8);
    dense::SquareMatrix<float>::~SquareMatrix(&local_c8);
    dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&nLeft_1);
  }
  else {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
    vVar7 = *pvVar9;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
    lVar12 = (long)(1 << ((bVar13 - (char)*pvVar9) - 1 & 0x1f));
    for (k_1 = 0; iVar8 = dense::SquareMatrix<float>::cols(matrix), k_1 < iVar8; k_1 = k_1 + 1) {
      for (i_1 = 0; i_1 < 1 << ((byte)vVar7 & 0x1f); i_1 = i_1 + 1) {
        for (i1 = 0; i1 < lVar12; i1 = i1 + 1) {
          i_00 = i1 + i_1 * lVar12 * 4;
          i_01 = i_00 + lVar12;
          i_02 = i_01 + lVar12;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_00,k_1);
          fVar1 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_01,k_1);
          fVar2 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_02,k_1);
          fVar14 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_02 + lVar12,k_1);
          fVar15 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,0);
          fVar16 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,1);
          fVar3 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,2);
          fVar4 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,3);
          fVar5 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_00,k_1);
          *pfVar11 = fVar5 * fVar15 + fVar4 * fVar14 + fVar16 * fVar1 + fVar3 * fVar2;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,0);
          fVar16 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,1);
          fVar3 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,2);
          fVar4 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,3);
          fVar5 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_01,k_1);
          *pfVar11 = fVar5 * fVar15 + fVar4 * fVar14 + fVar16 * fVar1 + fVar3 * fVar2;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,0);
          fVar16 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,1);
          fVar3 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,2);
          fVar4 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,2,3);
          fVar5 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_02,k_1);
          *pfVar11 = fVar5 * fVar15 + fVar4 * fVar14 + fVar16 * fVar1 + fVar3 * fVar2;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,0);
          fVar16 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,1);
          fVar3 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,2);
          fVar4 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,3,3);
          fVar5 = *pfVar11;
          pfVar11 = dense::SquareMatrix<float>::operator()(matrix,i_02 + lVar12,k_1);
          *pfVar11 = fVar5 * fVar15 + fVar4 * fVar14 + fVar16 * fVar1 + fVar3 * fVar2;
        }
      }
    }
  }
  dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&mat2.data_);
  return;
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }